

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cc
# Opt level: O2

void __thiscall
onmt::Tokenizer::annotate_tokens
          (Tokenizer *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *words,vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 *features,vector<onmt::Token,_std::allocator<onmt::Token>_> *tokens)

{
  string sStack_38;
  
  (*(this->super_ITokenizer)._vptr_ITokenizer[5])(&sStack_38,this,words);
  tokenize(this,&sStack_38,tokens,false);
  std::__cxx11::string::~string((string *)&sStack_38);
  return;
}

Assistant:

void Tokenizer::annotate_tokens(const std::vector<std::string>& words,
                                  const std::vector<std::vector<std::string>>& features,
                                  std::vector<Token>& tokens) const
  {
    tokenize(detokenize(words, features), tokens, /*training=*/false);
  }